

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O1

bool S2DecodePointsCompressed(Decoder *decoder,int level,Span<Vector3<double>_> points)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  VType *pVVar4;
  VType *pVVar5;
  VType VVar6;
  int iVar7;
  uint uVar8;
  uchar *puVar9;
  ulong uVar10;
  pointer pFVar11;
  uchar *puVar12;
  uint uVar13;
  long lVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  undefined4 in_register_00000034;
  pointer pFVar18;
  uchar *limit;
  VType *pVVar19;
  bool bVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  FaceRun *pFVar24;
  pointer pFVar25;
  _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  *this;
  size_type sVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  undefined8 uVar30;
  double dVar31;
  double dVar32;
  undefined8 uVar33;
  uint32 zig_zag_encoded_deriv_pi;
  uint64 interleaved_zig_zag_encoded_deriv_pi_qi;
  NthDerivativeCoder pi_coder;
  NthDerivativeCoder qi_coder;
  pointer local_108;
  uint local_100;
  uint local_fc;
  pointer local_f8;
  size_type local_f0;
  double local_e8;
  S2LogMessage local_e0;
  ulong local_d0;
  pointer local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  uint local_90 [12];
  double local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_f8 = (pointer)CONCAT44(in_register_00000034,level);
  local_f0 = points.len_;
  local_c8 = points.ptr_;
  local_108 = (pointer)0x0;
  pFVar25 = (pointer)0x0;
  pFVar18 = (pointer)0x0;
  iVar22 = 0;
  do {
    if ((int)local_f0 <= iVar22) goto LAB_00208c5d;
    local_e8 = (double)CONCAT44(local_e8._4_4_,iVar22);
    puVar12 = decoder->limit_;
    puVar9 = (uchar *)Varint::Parse64WithLimit((char *)decoder->buf_,(char *)puVar12,&local_c0);
    if (puVar9 == (uchar *)0x0) {
      uVar17 = 0;
      uVar23 = 0xffffffff;
      bVar20 = false;
    }
    else {
      decoder->buf_ = puVar9;
      uVar17 = local_c0 / 6;
      uVar23 = local_c0 % 6;
      bVar20 = (uint)(local_c0 >> 0x21) < 3 && 0 < (int)uVar17;
    }
    if (bVar20) {
      if (pFVar18 == pFVar25) {
        lVar14 = (long)pFVar18 - (long)local_108;
        if (lVar14 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = lVar14 >> 3;
        uVar21 = uVar10;
        if (pFVar18 == local_108) {
          uVar21 = 1;
        }
        this = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                *)(uVar21 + uVar10);
        if ((_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
             *)0xffffffffffffffe < this) {
          this = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                  *)0xfffffffffffffff;
        }
        if (CARRY8(uVar21,uVar10)) {
          this = (_Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                  *)0xfffffffffffffff;
        }
        pFVar11 = std::
                  _Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                  ::_M_allocate(this,(size_t)puVar12);
        *(ulong *)((long)pFVar11 + lVar14) = uVar17 << 0x20 | uVar23;
        pFVar24 = pFVar11;
        for (pFVar25 = local_108; pFVar18 != pFVar25; pFVar25 = pFVar25 + 1) {
          *pFVar24 = *pFVar25;
          pFVar24 = pFVar24 + 1;
        }
        if (local_108 != (pointer)0x0) {
          operator_delete(local_108);
        }
        pFVar25 = pFVar11 + (long)this;
        local_108 = pFVar11;
      }
      else {
        *pFVar18 = (FaceRun)(uVar17 << 0x20 | uVar23);
        pFVar24 = pFVar18;
      }
      pFVar18 = pFVar24 + 1;
      iVar22 = (int)uVar17 + local_e8._0_4_;
    }
    else {
      iVar22 = local_e8._0_4_;
    }
  } while (bVar20);
  if ((int)local_f0 <= local_e8._0_4_) {
LAB_00208c5d:
    uVar8 = 2;
    local_c0 = 2;
    local_b8 = 0;
    local_90[0] = 2;
    local_90[1] = 0;
    local_90[2] = 0;
    local_90[3] = 0;
    if (local_f0 != 0) {
      iVar7 = (int)local_f8 + 7;
      iVar22 = (int)local_f8 + 0xe;
      if (-1 < iVar7) {
        iVar22 = iVar7;
      }
      uVar17 = (ulong)((iVar22 >> 3) * 2);
      pFVar18 = (pointer)((long)pFVar18 - (long)local_108 >> 3);
      local_e8 = (double)(1 << ((byte)local_f8 & 0x1f));
      sVar26 = 0;
      uVar23 = 0;
      local_f8 = pFVar18;
      local_d0 = uVar17;
      do {
        if (sVar26 == 0) {
          puVar12 = decoder->buf_;
          uVar21 = (long)decoder->limit_ - (long)puVar12;
          if (decoder->limit_ < puVar12) {
            S2LogMessage::S2LogMessage
                      (&local_e0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                       ,0x1a1,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_e0.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
            goto LAB_0020945f;
          }
          uVar8 = 0;
          uVar13 = 0;
          if (uVar17 <= uVar21) {
            local_e0._0_8_ = 0;
            memcpy(&local_e0,puVar12,uVar17);
            decoder->buf_ = puVar12 + uVar17;
            util_bits::DeinterleaveUint32(local_e0._0_8_,&local_fc,&local_100);
            if (local_c0._4_4_ < (int)local_c0) {
              local_c0 = CONCAT44(local_c0._4_4_ + 1,(int)local_c0);
            }
            uVar8 = local_fc;
            if (0 < (long)local_c0._4_4_) {
              lVar14 = (long)local_c0._4_4_ + 1;
              do {
                uVar8 = uVar8 + *(int *)((long)&local_c0 + lVar14 * 4);
                *(uint *)((long)&local_c0 + lVar14 * 4) = uVar8;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            if ((int)local_90[1] < (int)local_90[0]) {
              local_90[1] = local_90[1] + 1;
            }
            uVar17 = local_d0;
            pFVar18 = local_f8;
            uVar13 = local_100;
            if (0 < (long)(int)local_90[1]) {
              lVar14 = (long)(int)local_90[1] + 1;
              do {
                uVar13 = uVar13 + local_90[lVar14];
                local_90[lVar14] = uVar13;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
          }
          if (uVar21 < uVar17) goto LAB_00209200;
        }
        else {
          puVar12 = (uchar *)Varint::Parse64WithLimit
                                       ((char *)decoder->buf_,(char *)decoder->limit_,
                                        (uint64 *)&local_e0);
          if (puVar12 == (uchar *)0x0) {
            uVar8 = 0;
            uVar13 = 0;
          }
          else {
            decoder->buf_ = puVar12;
            util_bits::DeinterleaveUint32(local_e0._0_8_,&local_fc,&local_100);
            if (local_c0._4_4_ < (int)local_c0) {
              local_c0 = CONCAT44(local_c0._4_4_ + 1,(int)local_c0);
            }
            uVar8 = -(local_fc & 1) ^ local_fc >> 1;
            if (0 < (long)local_c0._4_4_) {
              lVar14 = (long)local_c0._4_4_ + 1;
              do {
                uVar8 = uVar8 + *(int *)((long)&local_c0 + lVar14 * 4);
                *(uint *)((long)&local_c0 + lVar14 * 4) = uVar8;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            if ((int)local_90[1] < (int)local_90[0]) {
              local_90[1] = local_90[1] + 1;
            }
            uVar13 = -(local_100 & 1) ^ local_100 >> 1;
            if (0 < (long)(int)local_90[1]) {
              lVar14 = (long)(int)local_90[1] + 1;
              do {
                uVar13 = uVar13 + local_90[lVar14];
                local_90[lVar14] = uVar13;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
          }
          uVar17 = local_d0;
          pFVar18 = local_f8;
          if (puVar12 == (uchar *)0x0) goto LAB_00209200;
        }
        iVar22 = (int)uVar23;
        if (pFVar18 == (pointer)(long)iVar22) {
          S2LogMessage::S2LogMessage
                    (&local_e0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_compression.cc"
                     ,0x9d,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_e0.stream_,"Check failed: (faces_.size()) != (face_index_) ",0x2f);
          goto LAB_0020945f;
        }
        iVar7 = (int)(uVar23 >> 0x20);
        if (local_108[iVar22].count < iVar7) {
          S2LogMessage::S2LogMessage
                    (&local_e0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2point_compression.cc"
                     ,0x9e,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_e0.stream_,
                     "Check failed: (num_faces_used_for_index_) <= (faces_[face_index_].count) ",
                     0x49);
          goto LAB_0020945f;
        }
        uVar21 = (ulong)(iVar22 + 1);
        if (local_108[iVar22].count != iVar7) {
          uVar21 = uVar23;
        }
        dVar29 = ((double)(int)uVar8 + 0.5) / local_e8;
        if (0.5 <= dVar29) {
          dVar29 = dVar29 * 4.0 * dVar29 + -1.0;
        }
        else {
          dVar29 = (1.0 - dVar29) * -4.0 * (1.0 - dVar29) + 1.0;
        }
        uVar30 = 0;
        dVar29 = dVar29 * 0.3333333333333333;
        dVar31 = ((double)(int)uVar13 + 0.5) / local_e8;
        if (0.5 <= dVar31) {
          dVar31 = dVar31 * 4.0 * dVar31 + -1.0;
        }
        else {
          dVar31 = (1.0 - dVar31) * -4.0 * (1.0 - dVar31) + 1.0;
        }
        dVar31 = dVar31 * 0.3333333333333333;
        dVar32 = dVar31;
        uVar33 = 0;
        switch(local_108[(int)uVar21].face) {
        case 0:
          dVar32 = 1.0;
          uVar33 = 0;
          break;
        case 1:
          uVar33 = 0x8000000000000000;
          dVar32 = -dVar29;
          dVar29 = 1.0;
          uVar30 = 0;
          break;
        case 2:
          uVar30 = 0x8000000000000000;
          dVar32 = -dVar29;
          dVar29 = -dVar31;
          dVar31 = 1.0;
          uVar33 = uVar30;
          break;
        case 3:
          uVar30 = 0x8000000000000000;
          dVar28 = -dVar31;
          dVar31 = -dVar29;
          dVar32 = -1.0;
          dVar29 = dVar28;
          uVar33 = 0;
          break;
        case 4:
          dVar31 = -dVar29;
          uVar30 = 0;
          dVar29 = -1.0;
          break;
        default:
          dVar31 = -1.0;
        }
        dVar28 = dVar31 * dVar31 + dVar29 * dVar29 + dVar32 * dVar32;
        if (dVar28 < 0.0) {
          local_60 = dVar31;
          local_58 = dVar32;
          uStack_50 = uVar33;
          local_48 = dVar29;
          uStack_40 = uVar30;
          dVar28 = sqrt(dVar28);
          pFVar18 = local_f8;
          dVar29 = local_48;
          dVar32 = local_58;
          dVar31 = local_60;
        }
        else {
          dVar28 = SQRT(dVar28);
        }
        uVar23 = (uVar21 & 0xffffffff) + (uVar21 & 0xffffffff00000000 | 0xffffffff) + 1;
        dVar28 = (double)(~-(ulong)(dVar28 != 0.0) & (ulong)dVar28 |
                         (ulong)(1.0 / dVar28) & -(ulong)(dVar28 != 0.0));
        uVar8 = (int)sVar26 * 3;
        local_c8[sVar26].c_[0] = dVar32 * dVar28;
        local_c8[sVar26].c_[1] = dVar29 * dVar28;
        local_c8[sVar26].c_[2] = dVar31 * dVar28;
        sVar26 = sVar26 + 1;
      } while (sVar26 != local_f0);
    }
    pbVar2 = decoder->buf_;
    pbVar3 = decoder->limit_;
    if (pbVar2 < pbVar3) {
      bVar1 = *pbVar2;
      pFVar18 = (pointer)(ulong)bVar1;
      uVar8 = bVar1 & 0x7f;
      pbVar15 = pbVar2 + 1;
      if ((char)bVar1 < '\0') {
        if (pbVar3 <= pbVar2 + 1) goto LAB_002091ec;
        bVar1 = pbVar2[1];
        pFVar18 = (pointer)(ulong)bVar1;
        uVar8 = uVar8 | (bVar1 & 0x7f) << 7;
        pbVar15 = pbVar2 + 2;
        if ((char)bVar1 < '\0') {
          if (pbVar3 <= pbVar2 + 2) goto LAB_002091ec;
          bVar1 = pbVar2[2];
          pFVar18 = (pointer)(ulong)bVar1;
          uVar8 = uVar8 | (bVar1 & 0x7f) << 0xe;
          pbVar15 = pbVar2 + 3;
          if ((char)bVar1 < '\0') {
            if (pbVar3 <= pbVar2 + 3) goto LAB_002091ec;
            bVar1 = pbVar2[3];
            pFVar18 = (pointer)(ulong)bVar1;
            uVar8 = uVar8 | (bVar1 & 0x7f) << 0x15;
            pbVar15 = pbVar2 + 4;
            if ((char)bVar1 < '\0') {
              if (pbVar3 <= pbVar2 + 4) goto LAB_002091ec;
              uVar8 = uVar8 | (uint)pbVar2[4] << 0x1c;
              pbVar15 = (byte *)0x0;
              if (pbVar2[4] < 0x10) {
                pbVar15 = pbVar2 + 5;
              }
            }
          }
        }
      }
    }
    else {
LAB_002091ec:
      pbVar15 = (byte *)0x0;
    }
    if ((pbVar15 != (byte *)0x0) && (decoder->buf_ = pbVar15, uVar8 <= local_f0)) {
      bVar20 = uVar8 == 0;
      if (!bVar20) {
        uVar13 = 1;
        do {
          pVVar4 = (VType *)decoder->buf_;
          pVVar5 = (VType *)decoder->limit_;
          if (pVVar4 < pVVar5) {
            pVVar19 = (VType *)((long)pVVar4 + 1);
            uVar16 = *(byte *)pVVar4 & 0x7f;
            if ((char)*(byte *)pVVar4 < '\0') {
              if (pVVar19 < pVVar5) {
                pVVar19 = (VType *)((long)pVVar4 + 2);
                uVar16 = (*(byte *)((long)pVVar4 + 1) & 0x7f) << 7 | uVar16;
                if (-1 < (char)*(byte *)((long)pVVar4 + 1)) {
LAB_00209290:
                  pFVar18 = (pointer)(ulong)uVar16;
                  goto LAB_00209304;
                }
                if (pVVar19 < pVVar5) {
                  pVVar19 = (VType *)((long)pVVar4 + 3);
                  uVar16 = (*(byte *)((long)pVVar4 + 2) & 0x7f) << 0xe | uVar16;
                  if (-1 < (char)*(byte *)((long)pVVar4 + 2)) goto LAB_0020925c;
                  if (pVVar19 < pVVar5) {
                    pVVar19 = (VType *)((long)pVVar4 + 4);
                    uVar16 = (*(byte *)((long)pVVar4 + 3) & 0x7f) << 0x15 | uVar16;
                    if (-1 < (char)*(byte *)((long)pVVar4 + 3)) goto LAB_00209290;
                    if (pVVar19 < pVVar5) {
                      pFVar18 = (pointer)((ulong)pFVar18 & 0xffffffff);
                      pVVar19 = (VType *)0x0;
                      if (*(byte *)((long)pVVar4 + 4) < 0x10) {
                        pFVar18 = (pointer)(ulong)((uint)*(byte *)((long)pVVar4 + 4) << 0x1c |
                                                  uVar16);
                        pVVar19 = (VType *)((long)pVVar4 + 5);
                      }
                      goto LAB_00209304;
                    }
                  }
                }
              }
              pVVar19 = (VType *)0x0;
            }
            else {
LAB_0020925c:
              pFVar18 = (pointer)(ulong)uVar16;
            }
          }
          else {
            pVVar19 = (VType *)0x0;
          }
LAB_00209304:
          if (pVVar19 == (VType *)0x0) break;
          decoder->buf_ = (uchar *)pVVar19;
          uVar17 = (ulong)pFVar18 & 0xffffffff;
          if (local_f0 <= uVar17) break;
          pVVar4 = (VType *)decoder->buf_;
          if (pVVar5 < pVVar4) {
            S2LogMessage::S2LogMessage
                      (&local_e0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
                       ,0x1a1,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_e0.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
LAB_0020945f:
            abort();
          }
          if ((ulong)((long)pVVar5 - (long)pVVar4) < 0x18) break;
          local_c8[uVar17].c_[2] = pVVar4[2];
          VVar6 = pVVar4[1];
          local_c8[uVar17].c_[0] = *pVVar4;
          local_c8[uVar17].c_[1] = VVar6;
          decoder->buf_ = decoder->buf_ + 0x18;
          bVar20 = uVar8 <= uVar13;
          bVar27 = uVar13 != uVar8;
          uVar13 = uVar13 + 1;
        } while (bVar27);
      }
      goto LAB_00209202;
    }
  }
LAB_00209200:
  bVar20 = false;
LAB_00209202:
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108);
  }
  return bVar20;
}

Assistant:

bool S2DecodePointsCompressed(Decoder* decoder, int level,
                              Span<S2Point> points) {
  Faces faces;
  if (!faces.Decode(points.size(), decoder)) {
    return false;
  }

  NthDerivativeCoder pi_coder(kDerivativeEncodingOrder);
  NthDerivativeCoder qi_coder(kDerivativeEncodingOrder);
  Faces::Iterator faces_iterator = faces.GetIterator();
  for (int i = 0; i < points.size(); ++i) {
    pair<int, int> vertex_pi_qi;
    if (i == 0) {
      if (!DecodeFirstPointFixedLength(decoder, level, &pi_coder, &qi_coder,
                                       &vertex_pi_qi)) {
        return false;
      }
    } else {
      if (!DecodePointCompressed(decoder, level, &pi_coder, &qi_coder,
                                 &vertex_pi_qi)) {
        return false;
      }
    }

    int face = faces_iterator.Next();
    points[i] =
        FacePiQitoXYZ(face, vertex_pi_qi.first, vertex_pi_qi.second, level);
  }

  unsigned int num_off_center;
  if (!decoder->get_varint32(&num_off_center) ||
      num_off_center > points.size()) {
    return false;
  }
  for (int i = 0; i < num_off_center; ++i) {
    uint32 index;
    if (!decoder->get_varint32(&index) || index >= points.size()) {
      return false;
    }
    if (decoder->avail() < sizeof(points[index])) return false;
    decoder->getn(&points[index], sizeof(points[index]));
  }
  return true;
}